

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O2

gravity_value_t convert_value2string(gravity_vm *vm,gravity_value_t v)

{
  gravity_value_t *pgVar1;
  _Bool _Var2;
  uint32_t uVar3;
  gravity_class_t *pgVar4;
  gravity_closure_t *closure;
  gravity_closure_t *pgVar5;
  gravity_list_t *data;
  ulong uVar6;
  gravity_class_t **ppgVar7;
  gravity_delegate_t *pgVar8;
  char *pcVar9;
  long lVar10;
  int iVar11;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar12;
  char *__src;
  ulong uVar13;
  uint uVar14;
  size_t __n;
  gravity_class_t *pgVar15;
  char *pcVar16;
  uint uVar17;
  uint uVar18;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar19;
  ulong uVar20;
  size_t __n_00;
  gravity_list_t *list;
  uint uVar21;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar22;
  bool bVar23;
  gravity_value_t key;
  gravity_value_t v_00;
  gravity_value_t v_01;
  gravity_value_t gVar24;
  gravity_value_t gVar25;
  gravity_value_t gVar26;
  uint local_27c;
  char buffer [512];
  
  aVar12 = v.field_1;
  pgVar15 = v.isa;
  if (gravity_class_string == pgVar15) {
    return v;
  }
  if (gravity_class_int == pgVar15) {
    pcVar9 = "%ld";
LAB_00114d8f:
    snprintf(buffer,0x200,pcVar9,aVar12.n);
LAB_00114da6:
    pcVar9 = buffer;
    uVar3 = 0xffffffff;
    goto LAB_00114f45;
  }
  if (gravity_class_bool == pgVar15) {
    pcVar9 = "true";
    if (aVar12.n == 0) {
      pcVar9 = "false";
    }
  }
  else if (((ulong)gravity_class_null ^ (ulong)pgVar15) == 0 && aVar12.n == 0) {
LAB_00114d74:
    pcVar9 = "null";
  }
  else if (((ulong)gravity_class_null ^ (ulong)pgVar15) == 0 && aVar12.n == 1) {
    pcVar9 = "undefined";
  }
  else {
    if (gravity_class_float == pgVar15) {
      snprintf(buffer,0x200,"%g",aVar12.n);
LAB_00114efe:
      pcVar9 = buffer;
      uVar3 = 0xffffffff;
      goto LAB_00114f45;
    }
    if (gravity_class_class == pgVar15) {
      pcVar16 = (aVar12.p)->identifier;
      bVar23 = pcVar16 == (char *)0x0;
      pcVar9 = "anonymous class";
    }
    else if (gravity_class_function == pgVar15) {
      pcVar16 = (aVar12.p)->identifier;
      bVar23 = pcVar16 == (char *)0x0;
      pcVar9 = "anonymous func";
    }
    else {
      if (gravity_class_closure != pgVar15) {
        if (gravity_class_list == pgVar15) {
          uVar20 = 1;
          pcVar9 = (char *)gravity_calloc((gravity_vm *)0x0,1,0x201);
          *pcVar9 = '[';
          uVar18 = *(uint *)&(aVar12.p)->objclass;
          uVar21 = 0x200;
          uVar13 = 1;
          for (lVar10 = 0; iVar11 = (int)uVar13, (ulong)uVar18 << 4 != lVar10;
              lVar10 = lVar10 + 0x10) {
            pgVar15 = *(gravity_class_t **)(*(long *)&(aVar12.p)->has_outer + lVar10);
            aVar19 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)
                     ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)
                     (*(long *)&(aVar12.p)->has_outer + 8 + lVar10))->n;
            pcVar16 = "N/A";
            uVar14 = 3;
            if (aVar19.n != aVar12.n || gravity_class_list != pgVar15) {
              gVar24.field_1.n = aVar19.n;
              gVar24.isa = pgVar15;
              gVar24 = convert_value2string(vm,gVar24);
              aVar19 = gVar24.field_1;
              pcVar16 = "N/A";
              uVar14 = 3;
              if (aVar19.n != 0 && gVar24.isa != (gravity_class_t *)0x0) {
                pcVar16 = (char *)(aVar19.p)->objclass;
                uVar14 = *(uint *)((long)&(aVar19.p)->identifier + 4);
              }
            }
            uVar17 = uVar14 + iVar11 + 2;
            if (uVar21 < uVar17) {
              uVar21 = uVar17 + uVar21;
              pcVar9 = (char *)gravity_realloc((gravity_vm *)0x0,pcVar9,(ulong)uVar21);
            }
            uVar6 = (ulong)(iVar11 + uVar14);
            memcpy(pcVar9 + uVar13,pcVar16,(ulong)uVar14);
            if (uVar20 < uVar18) {
              pcVar9[uVar6] = ',';
              uVar6 = (ulong)(iVar11 + uVar14 + 1);
            }
            uVar20 = uVar20 + 1;
            uVar13 = uVar6;
          }
          pcVar9[uVar13] = ']';
          pcVar9[iVar11 + 1U] = '\0';
          gVar24 = gravity_string_to_value(vm,pcVar9,iVar11 + 1U);
LAB_001152fd:
          free(pcVar9);
          return gVar24;
        }
        if (gravity_class_map == pgVar15) {
          uVar20 = 1;
          pcVar9 = (char *)gravity_calloc((gravity_vm *)0x0,1,0x201);
          *pcVar9 = '[';
          uVar3 = gravity_hash_count((gravity_hash_t *)(aVar12.p)->objclass);
          data = gravity_list_new(vm,uVar3);
          gravity_hash_iterate((gravity_hash_t *)(aVar12.p)->objclass,map_keys_array,data);
          uVar6 = (ulong)(uint)(data->array).n;
          local_27c = 0x200;
          uVar13 = 1;
          for (lVar10 = 0; iVar11 = (int)uVar13, uVar6 << 4 != lVar10; lVar10 = lVar10 + 0x10) {
            pgVar1 = (data->array).p;
            pgVar15 = *(gravity_class_t **)((long)&pgVar1->isa + lVar10);
            aVar19 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)
                     ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)
                     ((long)&pgVar1->field_1 + lVar10))->n;
            gVar25.field_1.n = aVar19.n;
            gVar25.isa = pgVar15;
            key.field_1.n = aVar19.n;
            key.isa = pgVar15;
            ppgVar7 = &gravity_hash_lookup((gravity_hash_t *)(aVar12.p)->objclass,key)->isa;
            if ((gravity_value_t *)ppgVar7 == (gravity_value_t *)0x0) {
              ppgVar7 = &gravity_class_null;
              aVar22.n = 0;
            }
            else {
              aVar22 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)
                       (((gravity_value_t *)ppgVar7)->field_1).n;
            }
            pgVar4 = ((gravity_value_t *)ppgVar7)->isa;
            if (pgVar15 != gravity_class_string) {
              v_00.field_1.n = aVar19.n;
              v_00.isa = pgVar15;
              gVar25 = convert_value2string(vm,v_00);
              pgVar15 = gravity_class_string;
            }
            aVar19 = gVar25.field_1;
            if (gVar25.isa != pgVar15) {
              aVar19.n = 0;
            }
            if (aVar22.n == aVar12.n && gravity_class_map == pgVar4) {
              aVar22.n = 0;
              pgVar4 = gravity_class_null;
            }
            gVar26.field_1.n = aVar22.n;
            gVar26.isa = pgVar15;
            if (pgVar4 != pgVar15) {
              v_01.field_1.n = aVar22.n;
              v_01.isa = pgVar4;
              gVar26 = convert_value2string(vm,v_01);
              pgVar15 = gravity_class_string;
            }
            aVar22 = gVar26.field_1;
            if (gVar26.isa != pgVar15) {
              aVar22.n = 0;
            }
            pcVar16 = "N/A";
            __n = 3;
            if (aVar19.n != 0) {
              pcVar16 = (char *)(aVar19.p)->objclass;
              __n = (size_t)*(uint *)((long)&(aVar19.p)->identifier + 4);
            }
            __src = "N/A";
            __n_00 = 3;
            if (aVar22.n != 0) {
              __src = (char *)(aVar22.p)->objclass;
              __n_00 = (size_t)*(uint *)((long)&(aVar22.p)->identifier + 4);
            }
            uVar18 = iVar11 + (int)__n;
            uVar21 = uVar18 + (int)__n_00 + 4;
            if (local_27c < uVar21) {
              local_27c = uVar21 + local_27c;
              pcVar9 = (char *)gravity_realloc((gravity_vm *)0x0,pcVar9,(ulong)local_27c);
            }
            memcpy(pcVar9 + uVar13,pcVar16,__n);
            pcVar9[uVar18] = ':';
            memcpy(pcVar9 + ((int)__n + iVar11 + 1),__src,__n_00);
            iVar11 = uVar18 + (int)__n_00;
            uVar13 = (ulong)(iVar11 + 1);
            if (uVar20 < uVar6) {
              pcVar9[uVar13] = ',';
              uVar13 = (ulong)(iVar11 + 2);
            }
            uVar20 = uVar20 + 1;
          }
          pcVar9[uVar13] = ']';
          pcVar9[iVar11 + 1U] = '\0';
          gVar24 = gravity_string_to_value(vm,pcVar9,iVar11 + 1U);
          goto LAB_001152fd;
        }
        if (gravity_class_range != pgVar15) {
          if (gravity_class_fiber == pgVar15) {
            pcVar9 = "Fiber %p";
            goto LAB_00114d8f;
          }
          pgVar4 = gravity_value_getclass(v);
          closure = gravity_vm_fastlookup(vm,pgVar4,0x1c);
          if ((closure == (gravity_closure_t *)0x0) ||
             (((closure->f->tag == EXEC_TYPE_INTERNAL &&
               ((code *)(closure->f->field_9).field_0.cpool.n == convert_object_string)) ||
              (pgVar5 = gravity_vm_getclosure(vm), pgVar5 == closure)))) {
            if (gravity_class_instance != pgVar15) {
              return (gravity_value_t)(ZEXT816(0) << 0x40);
            }
            if ((vm != (gravity_vm *)0x0) && ((aVar12.p)->identifier != (char *)0x0)) {
              pgVar8 = gravity_vm_delegate(vm);
              if (pgVar8->bridge_string == (gravity_bridge_string)0x0) {
LAB_001153cf:
                return (gravity_value_t)(ZEXT816(0) << 0x40);
              }
              buffer[0] = '\0';
              buffer[1] = '\0';
              buffer[2] = '\0';
              buffer[3] = '\0';
              pcVar9 = (*pgVar8->bridge_string)(vm,(aVar12.p)->identifier,(uint32_t *)buffer);
              uVar3 = buffer._0_4_;
              if (pcVar9 == (char *)0x0) goto LAB_001153cf;
              goto LAB_00114f45;
            }
            pcVar9 = (aVar12.p)->objclass->identifier;
            pcVar16 = "anonymous class";
            if (pcVar9 != (char *)0x0) {
              pcVar16 = pcVar9;
            }
            snprintf(buffer,0x200,"instance of %s (%p)",pcVar16,aVar12.n);
            goto LAB_00114da6;
          }
          _Var2 = gravity_vm_runclosure(vm,closure,v,(gravity_value_t *)0x0,0);
          if (!_Var2) {
            return (gravity_value_t)ZEXT816(0);
          }
          gVar24 = gravity_vm_result(vm);
          if (gVar24.isa == gravity_class_string) {
            return gVar24;
          }
          goto LAB_00114d74;
        }
        snprintf(buffer,0x200,"%ld...%ld",(aVar12.p)->objclass,(aVar12.p)->identifier);
        goto LAB_00114efe;
      }
      pcVar16 = *(char **)((aVar12.p)->identifier + 0x38);
      bVar23 = pcVar16 == (char *)0x0;
      pcVar9 = "anonymous closure";
    }
    if (!bVar23) {
      pcVar9 = pcVar16;
    }
  }
  uVar3 = 0xffffffff;
LAB_00114f45:
  gVar24 = gravity_string_to_value(vm,pcVar9,uVar3);
  return gVar24;
}

Assistant:

inline gravity_value_t convert_value2string (gravity_vm *vm, gravity_value_t v) {
    if (VALUE_ISA_STRING(v)) return v;

    // handle conversion for basic classes
    if (VALUE_ISA_INT(v)) {
        char buffer[512];
        #if GRAVITY_ENABLE_INT64
        snprintf(buffer, sizeof(buffer), "%" PRId64, v.n);
        #else
        snprintf(buffer, sizeof(buffer), "%d", v.n);
        #endif
        return VALUE_FROM_CSTRING(vm, buffer);

    }
    if (VALUE_ISA_BOOL(v)) return VALUE_FROM_CSTRING(vm, (v.n) ? "true" : "false");
    if (VALUE_ISA_NULL(v)) return VALUE_FROM_CSTRING(vm, "null");
    if (VALUE_ISA_UNDEFINED(v)) return VALUE_FROM_CSTRING(vm, "undefined");
    
    if (VALUE_ISA_FLOAT(v)) {
        char buffer[512];
        snprintf(buffer, sizeof(buffer), "%g", v.f);
        return VALUE_FROM_CSTRING(vm, buffer);
    }

    if (VALUE_ISA_CLASS(v)) {
        const char *identifier = (VALUE_AS_CLASS(v)->identifier);
        if (!identifier) identifier = "anonymous class";
        return VALUE_FROM_CSTRING(vm, identifier);
    }

    if (VALUE_ISA_FUNCTION(v)) {
        const char *identifier = (VALUE_AS_FUNCTION(v)->identifier);
        if (!identifier) identifier = "anonymous func";
        return VALUE_FROM_CSTRING(vm, identifier);
    }

    if (VALUE_ISA_CLOSURE(v)) {
        const char *identifier = (VALUE_AS_CLOSURE(v)->f->identifier);
        if (!identifier) identifier = "anonymous closure";
        return VALUE_FROM_CSTRING(vm, identifier);
    }

    if (VALUE_ISA_LIST(v)) {
        gravity_list_t *list = VALUE_AS_LIST(v);
        return convert_list2string(vm, list);
    }

    if (VALUE_ISA_MAP(v)) {
        gravity_map_t *map = VALUE_AS_MAP(v);
        return convert_map2string(vm, map);
    }

    if (VALUE_ISA_RANGE(v)) {
        gravity_range_t *r = VALUE_AS_RANGE(v);
        char buffer[512];
        snprintf(buffer, sizeof(buffer), "%" PRId64 "...%" PRId64, r->from, r->to);
        return VALUE_FROM_CSTRING(vm, buffer);
    }
    
    if (VALUE_ISA_FIBER(v)) {
        char buffer[512];
        snprintf(buffer, sizeof(buffer), "Fiber %p", VALUE_AS_OBJECT(v));
        return VALUE_FROM_CSTRING(vm, buffer);
    }
    
    // check if class implements the String method (avoiding infinite loop by checking for convert_object_string)
    gravity_closure_t *closure = gravity_vm_fastlookup(vm, gravity_value_getclass(v), GRAVITY_STRING_INDEX);

    // sanity check (and break recursion)
    if ((!closure) || ((closure->f->tag == EXEC_TYPE_INTERNAL) && (closure->f->internal == convert_object_string)) || gravity_vm_getclosure(vm) == closure) {
		if (VALUE_ISA_INSTANCE(v)) {
			gravity_instance_t *instance = VALUE_AS_INSTANCE(v);
			if (vm && instance->xdata) {
				gravity_delegate_t *delegate = gravity_vm_delegate(vm);
				if (delegate->bridge_string) {
					uint32_t len = 0;
					const char *s = delegate->bridge_string(vm, instance->xdata, &len);
					if (s) return VALUE_FROM_STRING(vm, s, len);
				}
			} else {
				char buffer[512];
                const char *identifier = (instance->objclass->identifier);
                if (!identifier) identifier = "anonymous class";
                snprintf(buffer, sizeof(buffer), "instance of %s (%p)", identifier, instance);
                return VALUE_FROM_CSTRING(vm, buffer);
            }
        }
        return VALUE_FROM_ERROR(NULL);
    }

    // execute closure and return its value
    if (gravity_vm_runclosure(vm, closure, v, NULL, 0)) {
        gravity_value_t result = gravity_vm_result(vm);
        // sanity check closure return value because sometimes nil is returned by an objc instance (for example NSData String)
        if (!VALUE_ISA_STRING(result)) return VALUE_FROM_CSTRING(vm, "null");
        return result;
    }

    return VALUE_FROM_ERROR(NULL);
}